

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_tRNS(ucvector *out,LodePNGColorMode *info)

{
  LodePNGColorType LVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  uint unaff_EBP;
  size_t sVar5;
  uchar *chunk;
  uchar *local_28;
  
  local_28 = (uchar *)0x0;
  LVar1 = info->colortype;
  if (LVar1 == LCT_GREY) {
    if (info->key_defined != 0) {
      uVar3 = lodepng_chunk_init(&local_28,out,2,"tRNS");
      if (uVar3 != 0) {
        return uVar3;
      }
      local_28[8] = *(uchar *)((long)&info->key_r + 1);
      local_28[9] = (uchar)info->key_r;
    }
  }
  else if (LVar1 == LCT_RGB) {
    if (info->key_defined != 0) {
      uVar3 = lodepng_chunk_init(&local_28,out,6,"tRNS");
      if (uVar3 != 0) {
        return uVar3;
      }
      local_28[8] = *(uchar *)((long)&info->key_r + 1);
      local_28[9] = (uchar)info->key_r;
      local_28[10] = *(uchar *)((long)&info->key_g + 1);
      local_28[0xb] = (uchar)info->key_g;
      local_28[0xc] = *(uchar *)((long)&info->key_b + 1);
      local_28[0xd] = (uchar)info->key_b;
    }
  }
  else if (LVar1 == LCT_PALETTE) {
    sVar5 = info->palettesize;
    if (sVar5 != 0) {
      do {
        if (info->palette[sVar5 * 4 + -1] != 0xff) goto LAB_0012fb21;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
      sVar5 = 0;
    }
LAB_0012fb21:
    bVar2 = true;
    if (sVar5 != 0) {
      unaff_EBP = lodepng_chunk_init(&local_28,out,(uint)sVar5,"tRNS");
      if (unaff_EBP == 0) {
        sVar4 = 0;
        do {
          local_28[sVar4 + 8] = info->palette[sVar4 * 4 + 3];
          sVar4 = sVar4 + 1;
        } while (sVar5 != sVar4);
      }
      else {
        bVar2 = false;
      }
    }
    if (!bVar2) {
      return unaff_EBP;
    }
  }
  if (local_28 != (uchar *)0x0) {
    lodepng_chunk_generate_crc(local_28);
  }
  return 0;
}

Assistant:

static unsigned addChunk_tRNS(ucvector* out, const LodePNGColorMode* info) {
  unsigned char* chunk = 0;

  if (info->colortype == LCT_PALETTE) {
    size_t i, amount = info->palettesize;
    /*the tail of palette values that all have 255 as alpha, does not have to be encoded*/
    for (i = info->palettesize; i != 0; --i) {
      if (info->palette[4 * (i - 1) + 3] != 255) break;
      --amount;
    }
    if (amount) {
      CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, amount, "tRNS"));
      /*add the alpha channel values from the palette*/
      for (i = 0; i != amount; ++i) chunk[8 + i] = info->palette[4 * i + 3];
    }
  }
  else if (info->colortype == LCT_GREY) {
    if (info->key_defined) {
      CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 2, "tRNS"));
      chunk[8] = (unsigned char)(info->key_r >> 8);
      chunk[9] = (unsigned char)(info->key_r & 255);
    }
  }
  else if (info->colortype == LCT_RGB) {
    if (info->key_defined) {
      CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 6, "tRNS"));
      chunk[8] = (unsigned char)(info->key_r >> 8);
      chunk[9] = (unsigned char)(info->key_r & 255);
      chunk[10] = (unsigned char)(info->key_g >> 8);
      chunk[11] = (unsigned char)(info->key_g & 255);
      chunk[12] = (unsigned char)(info->key_b >> 8);
      chunk[13] = (unsigned char)(info->key_b & 255);
    }
  }

  if (chunk) lodepng_chunk_generate_crc(chunk);
  return 0;
}